

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

int executemacro(int f,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if ((macrodef == 0) && ((macrocount < 0x100 || (macro[0xff].m_funct == finishmacro)))) {
    if (macrocount != 0) {
      inmacro = 1;
      iVar1 = macrocount;
      for (; 0 < n; n = n + -1) {
        maclcur = maclhead->l_fp;
        iVar5 = 0;
        iVar2 = 1;
        iVar4 = 0;
        while (iVar4 < iVar1 + -1) {
          if (macro[iVar4].m_funct == universal_argument) {
            iVar3 = iVar4 + 1;
            iVar2 = macro[(long)iVar4 + 1].m_count;
            iVar5 = 7;
          }
          else {
            iVar2 = (*macro[iVar4].m_funct)(iVar5,iVar2);
            iVar1 = thisflag;
            if (iVar2 != 1) {
              inmacro = 0;
              return 0;
            }
            thisflag = 0;
            lastflag = iVar1;
            iVar5 = 0;
            iVar2 = 1;
            iVar1 = macrocount;
            iVar3 = iVar4;
          }
          iVar4 = iVar3 + 1;
        }
      }
      inmacro = 0;
    }
    return 1;
  }
  dobeep();
  ewprintf("Macro too long. Aborting.");
  return 0;
}

Assistant:

int
executemacro(int f, int n)
{
	int	 i, j, flag, num;
	PF	 funct;

	if (macrodef ||
	    (macrocount >= MAXMACRO && macro[MAXMACRO - 1].m_funct
	    != finishmacro)) {
		dobeep();
		ewprintf("Macro too long. Aborting.");
		return (FALSE);
	}

	if (macrocount == 0)
		return (TRUE);

	inmacro = TRUE;

	for (i = n; i > 0; i--) {
		maclcur = maclhead->l_fp;
		flag = 0;
		num = 1;
		for (j = 0; j < macrocount - 1; j++) {
			funct = macro[j].m_funct;
			if (funct == universal_argument) {
				flag = FFARG;
				num = macro[++j].m_count;
				continue;
			}
			if ((*funct)(flag, num) != TRUE) {
				inmacro = FALSE;
				return (FALSE);
			}
			lastflag = thisflag;
			thisflag = 0;
			flag = 0;
			num = 1;
		}
	}
	inmacro = FALSE;
	return (TRUE);
}